

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O2

size_t mserialize::
       StructSerializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
       ::serialized_size(WriterProp *t)

{
  size_t sVar1;
  long lVar2;
  size_t field_sizes [4];
  
  field_sizes[0] = 0;
  field_sizes[1] = 8;
  field_sizes[2] = (t->name)._M_string_length + 4;
  field_sizes[3] = 8;
  sVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    sVar1 = sVar1 + *(long *)((long)field_sizes + lVar2);
  }
  return sVar1;
}

Assistant:

static std::size_t serialized_size(const T& t)
  {
    const std::size_t field_sizes[] = {0, serialized_size_member(t, Members::value)...};

    std::size_t result = 0;
    for (auto s : field_sizes) { result += s; }
    return result;
  }